

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O1

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Remove
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  ulong uVar1;
  __int_type_conflict _Var2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  SpinLockHolder local_20;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    bVar6 = false;
  }
  else {
    local_20.lock_ = (SpinLock *)&hooklist_spinlock;
    LOCK();
    bVar6 = hooklist_spinlock == 0;
    if (bVar6) {
      hooklist_spinlock = 1;
    }
    UNLOCK();
    if (!bVar6) {
      SpinLock::SlowLock((SpinLock *)&hooklist_spinlock);
    }
    uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
    if (uVar1 == 0) {
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (this->priv_data[uVar3] == value) break;
        uVar3 = uVar3 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
      uVar3 = uVar4 & 0xffffffff;
    }
    bVar6 = uVar1 != uVar4;
    if (bVar6) {
      this->priv_data[uVar3] = (_func_void_void_ptr_unsigned_long *)0x0;
      _Var2 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
      if (_Var2 != 0) {
        lVar5 = _Var2 << 0x20;
        do {
          lVar5 = lVar5 + -0x100000000;
          if (*(long *)((long)this->priv_data + (lVar5 >> 0x1d)) != 0) goto LAB_0011fd79;
          _Var2 = _Var2 - 1;
        } while (_Var2 != 0);
        _Var2 = 0;
      }
LAB_0011fd79:
      (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var2;
    }
    SpinLockHolder::~SpinLockHolder(&local_20);
  }
  return bVar6;
}

Assistant:

bool HookList<T>::Remove(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  int index = 0;
  while (index < hooks_end
         && value != cast_priv_data(index)->load(std::memory_order_relaxed)) {
    ++index;
  }
  if (index == hooks_end) {
    return false;
  }
  cast_priv_data(index)->store(T{}, std::memory_order_relaxed);
  FixupPrivEndLocked();
  return true;
}